

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_AddingMultipleInfPositionalsSubcom_Test::TestBody
          (TApp_AddingMultipleInfPositionalsSubcom_Test *this)

{
  bool bVar1;
  App *pAVar2;
  AssertHelper local_170;
  Message local_168 [2];
  InvalidError *anon_var_0;
  char *pcStack_150;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_69;
  string local_68;
  App *local_48;
  App *below;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  two;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  one;
  TApp_AddingMultipleInfPositionalsSubcom_Test *this_local;
  
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&two.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&below);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"below",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"",&local_a1);
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_68,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"one",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"",&local_f1);
  CLI::App::add_option<std::__cxx11::string>
            (pAVar2,&local_c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&two.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pAVar2 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"two",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"",(allocator *)((long)&gtest_msg.value + 7));
  CLI::App::add_option<std::__cxx11::string>
            (pAVar2,&local_118,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&below,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffeb0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffeb0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00114048;
    pcStack_150 = 
    "Expected: run() throws an exception of type CLI::InvalidError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_168);
  testing::internal::AssertHelper::AssertHelper
            (&local_170,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x3e,pcStack_150);
  testing::internal::AssertHelper::operator=(&local_170,local_168);
  testing::internal::AssertHelper::~AssertHelper(&local_170);
  testing::Message::~Message(local_168);
LAB_00114048:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&below);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&two.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(TApp, AddingMultipleInfPositionalsSubcom) {
    std::vector<std::string> one, two;
    CLI::App *below = app.add_subcommand("below");
    below->add_option("one", one);
    below->add_option("two", two);

    EXPECT_THROW(run(), CLI::InvalidError);
}